

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O0

void __thiscall
cppcms::impl::tcp_pipe::tcp_pipe
          (tcp_pipe *this,shared_ptr<cppcms::http::context> *connection,string *ip,int port)

{
  io_service *piVar1;
  undefined4 in_ECX;
  string *in_RDX;
  long in_RDI;
  shared_ptr<cppcms::http::context> *in_stack_ffffffffffffff88;
  shared_ptr<cppcms::http::context> *in_stack_ffffffffffffff90;
  
  std::enable_shared_from_this<cppcms::impl::tcp_pipe>::enable_shared_from_this
            ((enable_shared_from_this<cppcms::impl::tcp_pipe> *)0x42c06b);
  std::shared_ptr<cppcms::http::context>::shared_ptr
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::string((string *)(in_RDI + 0x20),in_RDX);
  *(undefined4 *)(in_RDI + 0x40) = in_ECX;
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x42c0d1);
  http::context::service((context *)0x42c0d9);
  cppcms::service::impl((service *)0x42c0ea);
  piVar1 = service::get_io_service((service *)0x42c0fb);
  booster::aio::stream_socket::stream_socket((stream_socket *)(in_RDI + 0x68),piVar1);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x42c122);
  return;
}

Assistant:

tcp_pipe(booster::shared_ptr<http::context> connection,std::string const &ip,int port) :
				connection_(connection),
				ip_(ip),
				port_(port),
				socket_(connection_->service().impl().get_io_service())
			{
			}